

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

byte * __thiscall slang::BumpAllocator::allocate(BumpAllocator *this,size_t size,size_t alignment)

{
  byte *pbVar1;
  byte *next;
  byte *base;
  size_t alignment_local;
  size_t size_local;
  BumpAllocator *this_local;
  
  this_local = (BumpAllocator *)alignPtr(this->head->current,alignment);
  pbVar1 = (byte *)((long)&this_local->head + size);
  if (this->endPtr < pbVar1) {
    this_local = (BumpAllocator *)allocateSlow(this,size,alignment);
  }
  else {
    this->head->current = pbVar1;
  }
  return (byte *)this_local;
}

Assistant:

byte* allocate(size_t size, size_t alignment) {
        byte* base = alignPtr(head->current, alignment);
        byte* next = base + size;
        if (next > endPtr)
            return allocateSlow(size, alignment);

        head->current = next;
        return base;
    }